

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::
EachMatcher<iutest::detail::ElementsAreMatcher<iutest::detail::LtMatcher<int>,iutest::detail::LtMatcher<int>>>
::operator()(AssertionResult *__return_storage_ptr__,
            EachMatcher<iutest::detail::ElementsAreMatcher<iutest::detail::LtMatcher<int>,iutest::detail::LtMatcher<int>>>
            *this,int (*actual) [2] [2])

{
  bool bVar1;
  int (*begin) [2];
  int (*end) [2];
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  int (*local_20) [2] [2];
  int (*actual_local) [2] [2];
  EachMatcher<iutest::detail::ElementsAreMatcher<iutest::detail::LtMatcher<int>,_iutest::detail::LtMatcher<int>_>_>
  *this_local;
  
  local_20 = actual;
  actual_local = (int (*) [2] [2])this;
  this_local = (EachMatcher<iutest::detail::ElementsAreMatcher<iutest::detail::LtMatcher<int>,_iutest::detail::LtMatcher<int>_>_>
                *)__return_storage_ptr__;
  begin = const(actual);
  end = const(local_20);
  bVar1 = Each<int_const(*)[2]>(this,begin,end);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Each(begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }